

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrl_params_translate.c
# Opt level: O0

int fix_rsa_pss_saltlen(state state,translation_st *translation,translation_ctx_st *ctx)

{
  int iVar1;
  size_t sVar2;
  long in_RDX;
  int in_EDI;
  int val;
  size_t i_1;
  size_t i;
  int ret;
  translation_ctx_st *in_stack_00000190;
  translation_st *in_stack_00000198;
  state in_stack_000001a0;
  uint local_38;
  translation_ctx_st *in_stack_ffffffffffffffd0;
  ulong uVar3;
  translation_st *in_stack_ffffffffffffffd8;
  state in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = default_check(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd0);
  if (0 < local_4) {
    if ((in_EDI == 1) && (*(int *)(in_RDX + 8) == 1)) {
      *(undefined8 *)(in_RDX + 0x38) = *(undefined8 *)(in_RDX + 0x20);
      *(long *)(in_RDX + 0x20) = in_RDX + 0x40;
      *(undefined4 *)(in_RDX + 0x1c) = 0x32;
    }
    else if (((*(int *)(in_RDX + 8) == 2) && (in_EDI == 1)) ||
            ((*(int *)(in_RDX + 8) == 1 && (in_EDI == 8)))) {
      for (uVar3 = 0;
          (uVar3 < 3 && (*(uint *)(in_RDX + 0x1c) != fix_rsa_pss_saltlen::str_value_map[uVar3].id));
          uVar3 = uVar3 + 1) {
      }
      if (uVar3 == 3) {
        BIO_snprintf((char *)(in_RDX + 0x40),0x32,"%d",(ulong)*(uint *)(in_RDX + 0x1c));
      }
      else {
        strncpy((char *)(in_RDX + 0x40),(char *)fix_rsa_pss_saltlen::str_value_map[uVar3].ptr,0x31);
        *(undefined1 *)(in_RDX + 0x71) = 0;
      }
      *(long *)(in_RDX + 0x20) = in_RDX + 0x40;
      sVar2 = strlen(*(char **)(in_RDX + 0x20));
      *(int *)(in_RDX + 0x1c) = (int)sVar2;
    }
    local_4 = default_fixup_args(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
    if ((0 < local_4) &&
       (((*(int *)(in_RDX + 8) == 2 && (in_EDI == 7)) ||
        ((*(int *)(in_RDX + 8) == 1 && (in_EDI == 2)))))) {
      uVar3 = 0;
      while ((uVar3 < 3 &&
             (iVar1 = strcmp(*(char **)(in_RDX + 0x20),
                             (char *)fix_rsa_pss_saltlen::str_value_map[uVar3].ptr), iVar1 != 0))) {
        uVar3 = uVar3 + 1;
      }
      if (uVar3 == 3) {
        local_38 = atoi(*(char **)(in_RDX + 0x20));
      }
      else {
        local_38 = fix_rsa_pss_saltlen::str_value_map[uVar3].id;
      }
      if (in_EDI == 2) {
        **(uint **)(in_RDX + 0x38) = local_38;
      }
      else {
        *(uint *)(in_RDX + 0x1c) = local_38;
      }
      *(undefined8 *)(in_RDX + 0x20) = 0;
    }
  }
  return local_4;
}

Assistant:

static int fix_rsa_pss_saltlen(enum state state,
                               const struct translation_st *translation,
                               struct translation_ctx_st *ctx)
{
    static const OSSL_ITEM str_value_map[] = {
        { (unsigned int)RSA_PSS_SALTLEN_DIGEST, "digest" },
        { (unsigned int)RSA_PSS_SALTLEN_MAX,    "max"    },
        { (unsigned int)RSA_PSS_SALTLEN_AUTO,   "auto"   }
    };
    int ret;

    if ((ret = default_check(state, translation, ctx)) <= 0)
        return ret;

    if (state == PRE_CTRL_TO_PARAMS && ctx->action_type == GET) {
        /*
         * EVP_PKEY_CTRL_GET_RSA_PSS_SALTLEN returns the saltlen by filling
         * in the int pointed at by p2.  This is potentially as weird as
         * the way EVP_PKEY_CTRL_GET_RSA_PADDING works, except that saltlen
         * might be a negative value, so it wouldn't work as a legitimate
         * return value.
         * In any case, we must therefore remember |ctx->p2|, then make
         * |ctx->p2| point at a buffer to be filled in with the name, and
         * |ctx->p1| with its size.  default_fixup_args() will take care
         * of the rest for us, along with the POST_CTRL_TO_PARAMS && GET
         * code section further down.
         */
        ctx->orig_p2 = ctx->p2;
        ctx->p2 = ctx->name_buf;
        ctx->p1 = sizeof(ctx->name_buf);
    } else if ((ctx->action_type == SET && state == PRE_CTRL_TO_PARAMS)
        || (ctx->action_type == GET && state == POST_PARAMS_TO_CTRL)) {
        size_t i;

        for (i = 0; i < OSSL_NELEM(str_value_map); i++) {
            if (ctx->p1 == (int)str_value_map[i].id)
                break;
        }
        if (i == OSSL_NELEM(str_value_map)) {
            BIO_snprintf(ctx->name_buf, sizeof(ctx->name_buf), "%d", ctx->p1);
        } else {
            /* This won't truncate but it will quiet static analysers */
            strncpy(ctx->name_buf, str_value_map[i].ptr, sizeof(ctx->name_buf) - 1);
            ctx->name_buf[sizeof(ctx->name_buf) - 1] = '\0';
        }
        ctx->p2 = ctx->name_buf;
        ctx->p1 = strlen(ctx->p2);
    }

    if ((ret = default_fixup_args(state, translation, ctx)) <= 0)
        return ret;

    if ((ctx->action_type == SET && state == PRE_PARAMS_TO_CTRL)
        || (ctx->action_type == GET && state == POST_CTRL_TO_PARAMS)) {
        size_t i;
        int val;

        for (i = 0; i < OSSL_NELEM(str_value_map); i++) {
            if (strcmp(ctx->p2, str_value_map[i].ptr) == 0)
                break;
        }

        val = i == OSSL_NELEM(str_value_map) ? atoi(ctx->p2)
                                             : (int)str_value_map[i].id;
        if (state == POST_CTRL_TO_PARAMS) {
            /*
             * EVP_PKEY_CTRL_GET_RSA_PSS_SALTLEN weirdness explained further
             * up
             */
            *(int *)ctx->orig_p2 = val;
        } else {
            ctx->p1 = val;
        }
        ctx->p2 = NULL;
    }

    return ret;
}